

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QPixmapCache::Key>_>::erase
          (Span<QHashPrivate::Node<QString,_QPixmapCache::Key>_> *this,size_t bucket)

{
  Entry *pEVar1;
  byte bVar2;
  Entry *pEVar3;
  int *piVar4;
  
  bVar2 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar3 = this->entries;
  pEVar1 = pEVar3 + bVar2;
  QPixmapCache::Key::~Key((Key *)((pEVar1->storage).data + 0x18));
  piVar4 = *(int **)(pEVar1->storage).data;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate(*(QArrayData **)pEVar3[bVar2].storage.data,2,0x10);
    }
  }
  this->entries[bVar2].storage.data[0] = this->nextFree;
  this->nextFree = bVar2;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }